

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O2

int ngp_get_extver(char *extname,int *version)

{
  ulong uVar1;
  int iVar2;
  NGP_EXTVER_TAB *pNVar3;
  size_t sVar4;
  char *__dest;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  pNVar3 = ngp_extver_tab;
  iVar2 = 0x170;
  if (((version != (int *)0x0 && extname != (char *)0x0) &&
      (ngp_extver_tab != (NGP_EXTVER_TAB *)0x0 || ngp_extver_tab_size < 1)) &&
     (lVar6 = (long)ngp_extver_tab_size,
     ngp_extver_tab == (NGP_EXTVER_TAB *)0x0 || 0 < ngp_extver_tab_size)) {
    uVar7 = (ulong)(uint)ngp_extver_tab_size;
    if (ngp_extver_tab_size < 1) {
      uVar7 = 0;
    }
    uVar1 = 0;
    do {
      uVar5 = uVar1;
      if (uVar7 * 0x10 + 0x10 == uVar5 + 0x10) {
        if (pNVar3 == (NGP_EXTVER_TAB *)0x0) {
          pNVar3 = (NGP_EXTVER_TAB *)malloc(0x10);
        }
        else {
          pNVar3 = (NGP_EXTVER_TAB *)realloc(pNVar3,lVar6 * 0x10 + 0x10);
        }
        if (pNVar3 == (NGP_EXTVER_TAB *)0x0) {
          return 0x168;
        }
        sVar4 = strlen(extname);
        __dest = (char *)malloc(sVar4 + 1);
        if (__dest == (char *)0x0) {
          free(pNVar3);
          return 0x168;
        }
        strcpy(__dest,extname);
        lVar6 = (long)ngp_extver_tab_size;
        ngp_extver_tab = pNVar3;
        pNVar3[lVar6].extname = __dest;
        pNVar3[lVar6].version = 1;
        *version = 1;
        ngp_extver_tab_size = ngp_extver_tab_size + 1;
        goto LAB_001b2fa5;
      }
      iVar2 = strcmp(extname,*(char **)((long)&pNVar3->extname + uVar5));
      uVar1 = uVar5 + 0x10;
    } while (iVar2 != 0);
    iVar2 = *(int *)((long)&pNVar3->version + uVar5) + 1;
    *(int *)((long)&pNVar3->version + uVar5) = iVar2;
    *version = iVar2;
LAB_001b2fa5:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int	ngp_get_extver(char *extname, int *version)
 { NGP_EXTVER_TAB *p;
   char 	*p2;
   int		i;

   if ((NULL == extname) || (NULL == version)) return(NGP_BAD_ARG);
   if ((NULL == ngp_extver_tab) && (ngp_extver_tab_size > 0)) return(NGP_BAD_ARG);
   if ((NULL != ngp_extver_tab) && (ngp_extver_tab_size <= 0)) return(NGP_BAD_ARG);

   for (i=0; i<ngp_extver_tab_size; i++)
    { if (0 == strcmp(extname, ngp_extver_tab[i].extname))
        { *version = (++ngp_extver_tab[i].version);
          return(NGP_OK);
        }
    }

   if (NULL == ngp_extver_tab)
     { p = (NGP_EXTVER_TAB *)ngp_alloc(sizeof(NGP_EXTVER_TAB)); }
   else
     { p = (NGP_EXTVER_TAB *)ngp_realloc(ngp_extver_tab, (ngp_extver_tab_size + 1) * sizeof(NGP_EXTVER_TAB)); }

   if (NULL == p) return(NGP_NO_MEMORY);

   p2 = ngp_alloc(strlen(extname) + 1);
   if (NULL == p2)
     { ngp_free(p);
       return(NGP_NO_MEMORY);
     }

   strcpy(p2, extname);
   ngp_extver_tab = p;
   ngp_extver_tab[ngp_extver_tab_size].extname = p2;
   *version = ngp_extver_tab[ngp_extver_tab_size].version = 1;

   ngp_extver_tab_size++;

   return(NGP_OK);
 }